

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O0

int zip_resolve(PHYSFS_Io *io,ZIPinfo *info,ZIPentry *entry)

{
  ZipResolveType ZVar1;
  int local_2c;
  ZipResolveType resolve_type;
  int retval;
  ZIPentry *entry_local;
  ZIPinfo *info_local;
  PHYSFS_Io *io_local;
  
  local_2c = 1;
  ZVar1 = entry->resolved;
  if (ZVar1 == ZIP_DIRECTORY) {
    io_local._4_4_ = 1;
  }
  else if (ZVar1 == ZIP_BROKEN_FILE) {
    PHYSFS_setErrorCode(PHYSFS_ERR_CORRUPT);
    io_local._4_4_ = 0;
  }
  else if (ZVar1 == ZIP_BROKEN_SYMLINK) {
    PHYSFS_setErrorCode(PHYSFS_ERR_CORRUPT);
    io_local._4_4_ = 0;
  }
  else if (ZVar1 == ZIP_RESOLVING) {
    PHYSFS_setErrorCode(PHYSFS_ERR_SYMLINK_LOOP);
    io_local._4_4_ = 0;
  }
  else {
    if (ZVar1 != ZIP_RESOLVED) {
      if ((entry->tree).isdir != 0) {
        entry->resolved = ZIP_DIRECTORY;
        return 1;
      }
      local_2c = zip_parse_local(io,entry);
      if ((local_2c != 0) && (ZVar1 == ZIP_UNRESOLVED_SYMLINK)) {
        local_2c = zip_resolve_symlink(io,info,entry);
      }
      if (ZVar1 == ZIP_UNRESOLVED_SYMLINK) {
        ZVar1 = ZIP_BROKEN_SYMLINK;
        if (local_2c != 0) {
          ZVar1 = ZIP_RESOLVED;
        }
        entry->resolved = ZVar1;
      }
      else if (ZVar1 == ZIP_UNRESOLVED_FILE) {
        ZVar1 = ZIP_BROKEN_FILE;
        if (local_2c != 0) {
          ZVar1 = ZIP_RESOLVED;
        }
        entry->resolved = ZVar1;
      }
    }
    io_local._4_4_ = local_2c;
  }
  return io_local._4_4_;
}

Assistant:

static int zip_resolve(PHYSFS_Io *io, ZIPinfo *info, ZIPentry *entry)
{
    int retval = 1;
    const ZipResolveType resolve_type = entry->resolved;

    if (resolve_type == ZIP_DIRECTORY)
        return 1;   /* we're good. */

    /* Don't bother if we've failed to resolve this entry before. */
    BAIL_IF(resolve_type == ZIP_BROKEN_FILE, PHYSFS_ERR_CORRUPT, 0);
    BAIL_IF(resolve_type == ZIP_BROKEN_SYMLINK, PHYSFS_ERR_CORRUPT, 0);

    /* uhoh...infinite symlink loop! */
    BAIL_IF(resolve_type == ZIP_RESOLVING, PHYSFS_ERR_SYMLINK_LOOP, 0);

    /*
     * We fix up the offset to point to the actual data on the
     *  first open, since we don't want to seek across the whole file on
     *  archive open (can be SLOW on large, CD-stored files), but we
     *  need to check the local file header...not just for corruption,
     *  but since it stores offset info the central directory does not.
     */
    if (resolve_type != ZIP_RESOLVED)
    {
        if (entry->tree.isdir)  /* an ancestor dir that DirTree filled in? */
        {
            entry->resolved = ZIP_DIRECTORY;
            return 1;
        } /* if */

        retval = zip_parse_local(io, entry);
        if (retval)
        {
            /*
             * If it's a symlink, find the original file. This will cause
             *  resolution of other entries (other symlinks and, eventually,
             *  the real file) if all goes well.
             */
            if (resolve_type == ZIP_UNRESOLVED_SYMLINK)
                retval = zip_resolve_symlink(io, info, entry);
        } /* if */

        if (resolve_type == ZIP_UNRESOLVED_SYMLINK)
            entry->resolved = ((retval) ? ZIP_RESOLVED : ZIP_BROKEN_SYMLINK);
        else if (resolve_type == ZIP_UNRESOLVED_FILE)
            entry->resolved = ((retval) ? ZIP_RESOLVED : ZIP_BROKEN_FILE);
    } /* if */

    return retval;
}